

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68020_cpbcc_16(m68k_info *info)

{
  uint *puVar1;
  byte bVar2;
  uint uVar3;
  cs_m68k *pcVar4;
  
  if ((info->type & 0x1c) != 0) {
    puVar1 = &info->inst->Opcode;
    *puVar1 = *puVar1 + (info->ir & 0x2f);
    pcVar4 = build_init_op(info,0x5f,1,2);
    uVar3 = read_imm_16(info);
    pcVar4->operands[0].type = M68K_OP_BR_DISP;
    pcVar4->operands[0].address_mode = M68K_AM_BRANCH_DISPLACEMENT;
    pcVar4->operands[0].br_disp.disp = uVar3 + (uint)(uVar3 < 0x8000) * 0x10000 + -0x10000;
    pcVar4->operands[0].br_disp.disp_size = '\x02';
    bVar2 = info->groups_count;
    info->groups_count = bVar2 + 1;
    info->groups[bVar2] = '\x01';
    bVar2 = info->groups_count;
    info->groups_count = bVar2 + 1;
    info->groups[bVar2] = '\a';
    return;
  }
  d68000_invalid(info);
  return;
}

Assistant:

static void d68020_cpbcc_16(m68k_info *info)
{
	cs_m68k_op* op0;
	cs_m68k* ext;
	LIMIT_CPU_TYPES(info, M68020_PLUS);

	// these are all in row with the extension so just doing a add here is fine
	info->inst->Opcode += (info->ir & 0x2f);

	ext = build_init_op(info, M68K_INS_FBF, 1, 2);
	op0 = &ext->operands[0];

	make_cpbcc_operand(op0, M68K_OP_BR_DISP_SIZE_WORD, make_int_16(read_imm_16(info)));
	
	set_insn_group(info, M68K_GRP_JUMP);
	set_insn_group(info, M68K_GRP_BRANCH_RELATIVE);
}